

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O1

void __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::allocate
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this)

{
  pointer *pppTVar1;
  __atomic_flag_data_type _Var2;
  int iVar3;
  int iVar4;
  iterator __position;
  Task *pTVar5;
  Task *pTVar6;
  Task *pTVar7;
  bool bVar8;
  Task *h;
  Task *local_28;
  
  iVar3 = this->chunkSize_;
  iVar4 = this->minTSize_;
  local_28 = (Task *)malloc((long)(iVar4 * iVar3));
  pTVar7 = (Task *)((local_28->func_).super__Function_base._M_functor._M_pod_data +
                   (iVar3 + -1) * iVar4);
  pTVar5 = local_28;
  do {
    pTVar6 = (Task *)((pTVar5->func_).super__Function_base._M_functor._M_pod_data + iVar4);
    pTVar5->next = pTVar6;
    pTVar5 = pTVar6;
  } while (pTVar6 <= pTVar7);
  do {
    LOCK();
    _Var2 = (this->pool_mutex_).super___atomic_flag_base._M_i;
    (this->pool_mutex_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var2 != false);
  __position._M_current =
       (this->v_).
       super__Vector_base<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->v_).
      super__Vector_base<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<depspawn::internal::TaskPool::Task*,std::allocator<depspawn::internal::TaskPool::Task*>>
    ::_M_realloc_insert<depspawn::internal::TaskPool::Task*const&>
              ((vector<depspawn::internal::TaskPool::Task*,std::allocator<depspawn::internal::TaskPool::Task*>>
                *)this,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppTVar1 = &(this->v_).
                super__Vector_base<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  pTVar5 = (this->head_)._M_b._M_p;
  do {
    pTVar7->next = pTVar5;
    LOCK();
    pTVar6 = (this->head_)._M_b._M_p;
    bVar8 = pTVar5 == pTVar6;
    if (bVar8) {
      (this->head_)._M_b._M_p =
           (__pointer_type)
           (((ulong)pTVar5 & 0xffff000000000000) + 0x1000000000000 | (ulong)local_28);
      pTVar6 = pTVar5;
    }
    UNLOCK();
    pTVar5 = pTVar6;
  } while (!bVar8);
  (this->pool_mutex_).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }